

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueCollector.h
# Opt level: O3

void __thiscall
CliqueCollector::add
          (CliqueCollector *this,unique_ptr<Clique,_std::default_delete<Clique>_> *clique,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *appearanceMap)

{
  uint uVar1;
  pointer ppAVar2;
  _List_node_base *p_Var3;
  _func_int *p_Var4;
  deque<AlignmentRecord*,std::allocator<AlignmentRecord*>> *this_00;
  alignment_id_t aVar5;
  _List_node_base *p_Var6;
  AlignmentRecord *this_01;
  pointer *__ptr;
  AlignmentRecord **a;
  pointer ppAVar7;
  LogWriter *this_02;
  CliqueCollector *pCVar8;
  AlignmentRecord *al;
  undefined1 local_78 [24];
  _List_node_base *local_60;
  alignment_set_t *local_58;
  CliqueFinder *local_50;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Clique::getAllAlignments((Clique *)local_78);
  this_02 = this->lw;
  local_78._8_8_ = this;
  if (this_02 != (LogWriter *)0x0) {
    local_78._16_8_ = local_78 + 0x10;
    local_58 = (alignment_set_t *)0x0;
    ppAVar7 = (((_Vector_base<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)
               local_78._0_8_)->_M_impl).super__Vector_impl_data._M_start;
    ppAVar2 = (((_Vector_base<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)
               local_78._0_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_60 = (_List_node_base *)local_78._16_8_;
    local_50 = (CliqueFinder *)appearanceMap;
    if (ppAVar7 != ppAVar2) {
      do {
        aVar5 = AlignmentRecord::getID(*ppAVar7);
        p_Var6 = (_List_node_base *)operator_new(0x18);
        *(alignment_id_t *)&p_Var6[1]._M_next = aVar5;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        local_58 = (alignment_set_t *)
                   ((long)&(local_58->m_bits).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
        ppAVar7 = ppAVar7 + 1;
      } while (ppAVar7 != ppAVar2);
      this_02 = this->lw;
    }
    uVar1 = *(uint *)(local_78._8_8_ + 0x18);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              (&local_48,(list<unsigned_int,_std::allocator<unsigned_int>_> *)(local_78 + 0x10));
    LogWriter::reportClique(this_02,uVar1,&local_48);
    while (appearanceMap =
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_50, p_Var6 = (_List_node_base *)local_78._16_8_,
          local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)&local_48) {
      p_Var6 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &(local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      ._M_node.super__List_node_base._M_next);
      local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var6;
    }
    while (local_50 = (CliqueFinder *)appearanceMap, p_Var6 != (_List_node_base *)(local_78 + 0x10))
    {
      p_Var3 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var6->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var6);
      appearanceMap =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_50;
      p_Var6 = p_Var3;
    }
  }
  p_Var4 = *(_func_int **)local_78._0_8_;
  if ((ulong)((long)*(_func_int **)(local_78._0_8_ + 8) - (long)p_Var4) < 9) {
    this_01 = (AlignmentRecord *)operator_new(0x318);
    pCVar8 = (CliqueCollector *)local_78._8_8_;
    AlignmentRecord::AlignmentRecord(this_01,*(AlignmentRecord **)p_Var4);
    *(uint *)((long)pCVar8 + 0x18) = *(uint *)((long)pCVar8 + 0x18) + 1;
  }
  else {
    this_01 = (AlignmentRecord *)operator_new(0x318);
    pCVar8 = (CliqueCollector *)local_78._8_8_;
    uVar1 = *(uint *)(local_78._8_8_ + 0x18);
    *(uint *)(local_78._8_8_ + 0x18) = uVar1 + 1;
    AlignmentRecord::AlignmentRecord
              (this_01,(unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                        *)local_78,uVar1,appearanceMap);
  }
  this_00 = (deque<AlignmentRecord*,std::allocator<AlignmentRecord*>> *)pCVar8->superReads;
  local_78._16_8_ = this_01;
  if (*(undefined8 **)(this_00 + 0x30) == (undefined8 *)(*(long *)(this_00 + 0x40) + -8)) {
    std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>::
    _M_push_back_aux<AlignmentRecord*const&>(this_00,(AlignmentRecord **)(local_78 + 0x10));
  }
  else {
    **(undefined8 **)(this_00 + 0x30) = this_01;
    *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
  }
  if ((tuple<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_*,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
       )local_78._0_8_ !=
      (_Head_base<0UL,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_*,_false>
       )0x0) {
    if (*(_func_int **)local_78._0_8_ != (_func_int *)0x0) {
      operator_delete(*(_func_int **)local_78._0_8_);
    }
    operator_delete((void *)local_78._0_8_);
  }
  return;
}

Assistant:

void add(std::unique_ptr<Clique> clique,std::map<std::string,int>* appearanceMap) {
        assert(clique.get() != nullptr);

//        std::cerr << "Clique " << id << std::endl;
        std::unique_ptr<std::vector<const AlignmentRecord*>> alignments = clique->getAllAlignments();

        if (lw != nullptr) {
            std::list<unsigned int> cll;            
            for (const auto& a : *alignments) {
                cll.push_back(a->getID());
            }
            lw->reportClique(this->id, cll);
        }

        AlignmentRecord* al;

        if (alignments->size() > 1) {
            al = new AlignmentRecord(alignments, this->id++,appearanceMap);
        } else {
            al = new AlignmentRecord(*(alignments->front()));
            this->id++;
        }

        superReads->push_back(al);
    }